

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infcover.c
# Opt level: O0

void * mem_alloc(void *mem,uint count,uint size)

{
  size_t __size;
  undefined8 *puVar1;
  uint in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  size_t len;
  mem_zone *zone;
  mem_item *item;
  void *ptr;
  void *local_8;
  
  __size = (ulong)in_ESI * (ulong)in_EDX;
  if ((in_RDI == (undefined8 *)0x0) || ((in_RDI[3] != 0 && ((ulong)in_RDI[3] < in_RDI[1] + __size)))
     ) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = malloc(__size);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      memset(local_8,0xa5,__size);
      puVar1 = (undefined8 *)malloc(0x18);
      if (puVar1 == (undefined8 *)0x0) {
        free(local_8);
        local_8 = (void *)0x0;
      }
      else {
        *puVar1 = local_8;
        puVar1[1] = __size;
        puVar1[2] = *in_RDI;
        *in_RDI = puVar1;
        in_RDI[1] = puVar1[1] + in_RDI[1];
        if ((ulong)in_RDI[2] < (ulong)in_RDI[1]) {
          in_RDI[2] = in_RDI[1];
        }
      }
    }
  }
  return local_8;
}

Assistant:

static void *mem_alloc(void *mem, unsigned count, unsigned size) {
    void *ptr;
    struct mem_item *item;
    struct mem_zone *zone = mem;
    size_t len = count * (size_t)size;

    /* induced allocation failure */
    if (zone == NULL || (zone->limit && zone->total + len > zone->limit))
        return NULL;

    /* perform allocation using the standard library, fill memory with a
       non-zero value to make sure that the code isn't depending on zeros */
    ptr = malloc(len);
    if (ptr == NULL)
        return NULL;
    memset(ptr, 0xa5, len);

    /* create a new item for the list */
    item = malloc(sizeof(struct mem_item));
    if (item == NULL) {
        free(ptr);
        return NULL;
    }
    item->ptr = ptr;
    item->size = len;

    /* insert item at the beginning of the list */
    item->next = zone->first;
    zone->first = item;

    /* update the statistics */
    zone->total += item->size;
    if (zone->total > zone->highwater)
        zone->highwater = zone->total;

    /* return the allocated memory */
    return ptr;
}